

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r)

{
  REF_DBL *m1;
  double dVar1;
  int node;
  int node_00;
  REF_NODE ref_node;
  REF_NODE pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  ulong uVar5;
  long lVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  REF_EDGE ref_edge;
  REF_DBL limit_metric [6];
  REF_DBL limited [6];
  
  ref_node = ref_grid->node;
  dVar14 = log(r);
  uVar3 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar3 == 0) {
    pRVar2 = ref_grid->node;
    uVar3 = pRVar2->max;
    if ((int)uVar3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __ptr = malloc((ulong)uVar3 * 0x30);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    pRVar7 = metric;
    pvVar9 = __ptr;
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      if (-1 < pRVar2->global[uVar5]) {
        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
          *(REF_DBL *)((long)pvVar9 + lVar10 * 8) = pRVar7[lVar10];
        }
      }
      pvVar9 = (void *)((long)pvVar9 + 0x30);
      pRVar7 = pRVar7 + 6;
    }
    for (lVar10 = 0; lVar10 < ref_edge->n; lVar10 = lVar10 + 1) {
      node = ref_edge->e2n[lVar10 * 2];
      lVar13 = (long)node;
      node_00 = ref_edge->e2n[lVar10 * 2 + 1];
      lVar11 = (long)node_00;
      pRVar7 = ref_node->real;
      dVar19 = pRVar7[lVar11 * 0xf] - pRVar7[lVar13 * 0xf];
      dVar18 = pRVar7[lVar11 * 0xf + 1] - pRVar7[lVar13 * 0xf + 1];
      dVar17 = pRVar7[lVar11 * 0xf + 2] - pRVar7[lVar13 * 0xf + 2];
      dVar15 = *(double *)((long)__ptr + lVar11 * 0x30 + 8);
      dVar16 = *(double *)((long)__ptr + lVar11 * 0x30 + 0x10);
      dVar1 = *(double *)((long)__ptr + lVar11 * 0x30 + 0x20);
      dVar15 = (*(double *)((long)__ptr + lVar11 * 0x30 + 0x28) * dVar17 +
               dVar16 * dVar19 + dVar1 * dVar18) * dVar17 +
               (dVar16 * dVar17 +
               *(double *)((long)__ptr + lVar11 * 0x30) * dVar19 + dVar18 * dVar15) * dVar19 +
               (dVar1 * dVar17 +
               dVar15 * dVar19 + *(double *)((long)__ptr + lVar11 * 0x30 + 0x18) * dVar18) * dVar18;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      pRVar7 = (REF_DBL *)((long)__ptr + lVar11 * 0x30);
      dVar16 = pow(dVar15 * dVar14 + 1.0,-2.0);
      for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
        limit_metric[lVar6] = pRVar7[lVar6] * dVar16;
      }
      m1 = (REF_DBL *)((long)__ptr + lVar13 * 0x30);
      RVar4 = ref_matrix_intersect(m1,limit_metric,limited);
      if (RVar4 == 0) {
        RVar4 = ref_matrix_intersect(metric + lVar13 * 6,limited,metric + lVar13 * 6);
        if (RVar4 != 0) {
          uVar8 = 0x307;
          pcVar12 = "update m0";
          goto LAB_001ab782;
        }
        dVar15 = (m1[5] * dVar17 + m1[2] * dVar19 + dVar18 * m1[4]) * dVar17 +
                 (m1[2] * dVar17 + *m1 * dVar19 + dVar18 * m1[1]) * dVar19 +
                 (m1[4] * dVar17 + m1[1] * dVar19 + m1[3] * dVar18) * dVar18;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar16 = pow(dVar15 * dVar14 + 1.0,-2.0);
        for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
          limit_metric[lVar13] = m1[lVar13] * dVar16;
        }
        RVar4 = ref_matrix_intersect(pRVar7,limit_metric,limited);
        if (RVar4 != 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x313,"ref_metric_metric_space_gradation","limit m1 with enlarged m0");
LAB_001ab953:
          ref_node_location(ref_node,node_00);
          printf("ratio %24.15e enlarge %24.15e \n",dVar15,dVar16);
          goto LAB_001ab7b8;
        }
        RVar4 = ref_matrix_intersect(metric + lVar11 * 6,limited,metric + lVar11 * 6);
        if (RVar4 != 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x31b,"ref_metric_metric_space_gradation","update m1");
          goto LAB_001ab953;
        }
      }
      else {
        uVar8 = 0x2ff;
        pcVar12 = "limit m0 with enlarged m1";
LAB_001ab782:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar8,"ref_metric_metric_space_gradation",pcVar12);
        ref_node_location(ref_node,node);
        printf("ratio %24.15e enlarge %24.15e \n",dVar15,dVar16);
LAB_001ab7b8:
        puts("RECOVER ref_metric_metric_space_gradation");
      }
    }
    free(__ptr);
    ref_edge_free(ref_edge);
    uVar3 = ref_node_ghost_dbl(ref_grid->node,metric,6);
    if (uVar3 == 0) {
      return 0;
    }
    pcVar12 = "update ghosts";
    uVar8 = 0x327;
  }
  else {
    pcVar12 = "orig edges";
    uVar8 = 0x2e5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
         "ref_metric_metric_space_gradation",(ulong)uVar3,pcVar12);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,
                                                     REF_GRID ref_grid,
                                                     REF_DBL r) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028 equation (9) */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node1] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m0 with enlarged m1");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node0]), limited,
                                            &(metric[6 * node0]))) {
      REF_WHERE("update m0");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node0] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m1 with enlarged m0");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node1]), limited,
                                            &(metric[6 * node1]))) {
      REF_WHERE("update m1");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}